

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O0

void __thiscall irr::gui::CGUISpriteBank::clear(CGUISpriteBank *this)

{
  u32 uVar1;
  ITexture **ppIVar2;
  u32 i;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  while( true ) {
    uVar4 = uVar3;
    uVar1 = core::array<irr::video::ITexture_*>::size((array<irr::video::ITexture_*> *)0x3d4051);
    if (uVar1 <= uVar3) break;
    ppIVar2 = core::array<irr::video::ITexture_*>::operator[]
                        ((array<irr::video::ITexture_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
    if (*ppIVar2 != (ITexture *)0x0) {
      core::array<irr::video::ITexture_*>::operator[]
                ((array<irr::video::ITexture_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      IReferenceCounted::drop
                ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
      ;
    }
    uVar3 = uVar4 + 1;
  }
  core::array<irr::video::ITexture_*>::clear
            ((array<irr::video::ITexture_*> *)CONCAT44(uVar4,in_stack_fffffffffffffff0));
  core::array<irr::gui::SGUISprite>::clear
            ((array<irr::gui::SGUISprite> *)CONCAT44(uVar4,in_stack_fffffffffffffff0));
  core::array<irr::core::rect<int>_>::clear
            ((array<irr::core::rect<int>_> *)CONCAT44(uVar4,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void CGUISpriteBank::clear()
{
	// drop textures
	for (u32 i = 0; i < Textures.size(); ++i) {
		if (Textures[i])
			Textures[i]->drop();
	}
	Textures.clear();
	Sprites.clear();
	Rectangles.clear();
}